

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

LBBox3fa * __thiscall
embree::SceneGraph::GridMeshNode::lbounds(LBBox3fa *__return_storage_ptr__,GridMeshNode *this)

{
  undefined1 auVar1 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  pointer pvVar4;
  ulong uVar5;
  pointer pvVar6;
  size_t size;
  long lVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  avector<BBox<Vec3fa>_> aStack_38;
  
  pvVar6 = (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  aStack_38.size_active = 0;
  aStack_38.size_alloced = 0;
  aStack_38.items = (BBox<embree::Vec3fa> *)0x0;
  size = (long)pvVar4 - (long)pvVar6;
  if (size != 0) {
    aStack_38.items = (BBox<embree::Vec3fa> *)alignedMalloc(size,0x10);
    pvVar6 = (this->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (this->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    aStack_38.size_alloced = (long)size >> 5;
  }
  aVar3 = _DAT_0024ac20;
  aVar2 = _DAT_0024ac10;
  if (pvVar4 != pvVar6) {
    uVar5 = 0;
    do {
      aVar8 = aVar3;
      aVar9 = aVar2;
      if (pvVar6[uVar5].size_active != 0) {
        lVar7 = 0;
        do {
          auVar1 = *(undefined1 (*) [16])((long)&(pvVar6[uVar5].items)->field_0 + lVar7);
          aVar9.m128 = (__m128)minps(aVar9.m128,auVar1);
          aVar8.m128 = (__m128)maxps(aVar8.m128,auVar1);
          lVar7 = lVar7 + 0x10;
        } while (pvVar6[uVar5].size_active << 4 != lVar7);
      }
      aStack_38.items[uVar5].lower.field_0 = aVar9;
      aStack_38.items[uVar5].upper.field_0 = aVar8;
      uVar5 = uVar5 + 1;
      pvVar6 = (this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 5));
  }
  aStack_38.size_active = aStack_38.size_alloced;
  LBBox<embree::Vec3fa>::LBBox(__return_storage_ptr__,&aStack_38);
  alignedFree(aStack_38.items);
  return __return_storage_ptr__;
}

Assistant:

virtual LBBox3fa lbounds() const
      {
        avector<BBox3fa> bboxes(positions.size());
        for (size_t t=0; t<positions.size(); t++) {
          BBox3fa b = empty;
          for (auto& x : positions[t]) b.extend(x);
          bboxes[t] = b;
        }
        return LBBox3fa(bboxes);
      }